

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::NamespacePrinter::~NamespacePrinter(NamespacePrinter *this)

{
  Printer *this_00;
  size_t in_R9;
  pointer pbVar1;
  string_view text;
  string_view format;
  char *local_68;
  size_t local_60;
  char local_58;
  undefined7 uStack_57;
  size_type local_48;
  pointer local_40;
  
  pbVar1 = (this->namespace_components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != (this->namespace_components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      this_00 = this->p_;
      local_40 = pbVar1[-1]._M_dataplus._M_p;
      local_48 = pbVar1[-1]._M_string_length;
      local_60 = 0;
      local_58 = '\0';
      format._M_str = (char *)&local_48;
      format._M_len = (size_t)"}  // namespace $0\n";
      local_68 = &local_58;
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_68,(Nonnull<std::string_*>)&DAT_00000013,format,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      text._M_str = local_68;
      text._M_len = local_60;
      io::Printer::Print<>(this_00,text);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      pbVar1 = pbVar1 + -1;
    } while (pbVar1 != (this->namespace_components_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->namespace_components_);
  return;
}

Assistant:

NamespacePrinter::~NamespacePrinter() {
  // Close the namespace.
  for (auto it = namespace_components_.rbegin();
       it != namespace_components_.rend(); ++it) {
    p_->Print(absl::Substitute("}  // namespace $0\n", *it));
  }
}